

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

uint __thiscall Compiler::evaluateBracket(Compiler *this,string *originalLine)

{
  char cVar1;
  pointer pbVar2;
  Parser *this_00;
  bool bVar3;
  Scope *pSVar4;
  Instruction op;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __tmp;
  pointer pbVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  uint argCount;
  string *identifier;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_149;
  string arg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  components;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_100;
  Parser *local_e8;
  string *local_e0;
  string *local_d8;
  anon_class_8_1_8991fb9c addVariableToStack;
  string peiceBuffer;
  string local_a8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  string line;
  string local_50;
  
  addVariableToStack.this = this;
  std::__cxx11::string::string((string *)&local_50,(string *)originalLine);
  Parser::extractBracketArguments(&local_100,&this->parser,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  pbVar2 = local_100.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar5 = local_100.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar2; pbVar5 = pbVar5 + 1) {
    while (*(pbVar5->_M_dataplus)._M_p == ' ') {
      std::__cxx11::string::erase((ulong)pbVar5,0);
    }
    std::__cxx11::string::insert((ulong)pbVar5,(char *)0x0);
    while ((pbVar5->_M_dataplus)._M_p[pbVar5->_M_string_length - 1] == ' ') {
      std::__cxx11::string::erase((ulong)pbVar5,pbVar5->_M_string_length - 1);
    }
    std::__cxx11::string::append((char *)pbVar5);
  }
  local_e8 = &this->parser;
  while (this_00 = local_e8,
        local_100.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_100.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
    Parser::bracketOperatorFix
              (&line,local_e8,
               local_100.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1);
    components.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    components.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    components.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Parser::extractBracket(this_00,&line,&components);
    argCount = 0;
    uVar9 = 0;
    local_e0 = local_100.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
    while( true ) {
      iVar7 = (int)uVar9;
      if ((ulong)((long)components.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)components.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar9) break;
      identifier = components.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar9;
      pSVar4 = getPastScope(this,identifier);
      if (pSVar4 == (Scope *)0x0) {
        peiceBuffer._M_dataplus._M_p = (pointer)&peiceBuffer.field_2;
        peiceBuffer._M_string_length = 0;
        arg.field_2._M_allocated_capacity = 0;
        peiceBuffer.field_2._M_local_buf[0] = '\0';
        arg._M_dataplus._M_p = (pointer)0x0;
        arg._M_string_length = 0;
        bVar3 = false;
        for (uVar8 = 0; (ulong)uVar8 < identifier->_M_string_length; uVar8 = uVar8 + 1) {
          cVar1 = (identifier->_M_dataplus)._M_p[uVar8];
          bVar3 = (bool)(bVar3 ^ cVar1 == '\"');
          if ((cVar1 != ' ') || (bVar3)) {
            std::__cxx11::string::push_back((char)&peiceBuffer);
          }
          else {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&arg,
                       &peiceBuffer);
            peiceBuffer._M_string_length = 0;
            *peiceBuffer._M_dataplus._M_p = '\0';
          }
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&arg,
                   &peiceBuffer);
        __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (arg._M_string_length - 0x20);
        bVar3 = std::operator==(__lhs,"+");
        op = MATH_ADD;
        if (!bVar3) {
          bVar3 = std::operator==(__lhs,"-");
          op = MATH_SUBTRACT;
          if (!bVar3) {
            bVar3 = std::operator==(__lhs,"*");
            op = MATH_MULTIPLY;
            if (!bVar3) {
              bVar3 = std::operator==(__lhs,"/");
              op = MATH_DIVIDE;
              if (!bVar3) {
                bVar3 = std::operator==(__lhs,"%");
                op = MATH_MOD;
                if (!bVar3) {
                  bVar3 = std::operator==(__lhs,"@");
                  op = CONCENTRATE_STRINGS;
                  if (!bVar3) {
                    bVar3 = std::operator==(__lhs,"==");
                    op = COMPARE_EQUAL;
                    if (!bVar3) {
                      bVar3 = std::operator==(__lhs,"!=");
                      op = COMPARE_UNEQUAL;
                      if (!bVar3) {
                        bVar3 = std::operator==(__lhs,"<");
                        op = COMPARE_LESS_THAN;
                        if (!bVar3) {
                          bVar3 = std::operator==(__lhs,">");
                          op = COMPARE_MORE_THAN;
                          if (!bVar3) {
                            bVar3 = std::operator==(__lhs,"<=");
                            op = COMPARE_LESS_THAN_OR_EQUAL;
                            if (!bVar3) {
                              bVar3 = std::operator==(__lhs,">=");
                              op = COMPARE_MORE_THAN_OR_EQUAL;
                              if (!bVar3) {
                                bVar3 = std::operator==(__lhs,"&");
                                op = COMPARE_AND;
                                if (!bVar3) {
                                  bVar3 = std::operator==(__lhs,"|");
                                  op = (uint)bVar3 + NONE | COMPARE_OR;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        uVar8 = 0;
        local_d8 = __lhs;
        while( true ) {
          uVar9 = arg._M_string_length - (long)arg._M_dataplus._M_p;
          if (((long)uVar9 >> 5) - 1U <= (ulong)uVar8) break;
          evaluateBracket::anon_class_8_1_8991fb9c::operator()
                    (&addVariableToStack,(string *)(arg._M_dataplus._M_p + (ulong)uVar8 * 0x20));
          uVar8 = uVar8 + 1;
        }
        if (op == NONE) {
          if (uVar9 == 0x20) {
            evaluateBracket::anon_class_8_1_8991fb9c::operator()(&addVariableToStack,local_d8);
            uVar9 = arg._M_string_length - (long)arg._M_dataplus._M_p;
          }
          else {
            argCount = argCount - 1;
          }
          argCount = (int)(uVar9 >> 5) + argCount;
        }
        else if (uVar9 == 0x20) {
          InstructionGenerator::genOperator(&this->igen,op,argCount);
          argCount = 1;
        }
        else {
          InstructionGenerator::genOperator(&this->igen,op,(int)((long)uVar9 >> 5) - 1);
          argCount = argCount + 1;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&arg);
        std::__cxx11::string::~string((string *)&peiceBuffer);
      }
      else {
        arg._M_dataplus._M_p = (pointer)&arg.field_2;
        arg._M_string_length = 0;
        arg.field_2._M_allocated_capacity = arg.field_2._M_allocated_capacity & 0xffffffffffffff00;
        if (pSVar4->argumentCount != 0) {
          iVar7 = iVar7 + 1;
          std::__cxx11::string::_M_assign((string *)&arg);
        }
        std::__cxx11::string::string((string *)&peiceBuffer,(string *)identifier);
        std::__cxx11::string::string(local_a8,(string *)&arg);
        __l._M_len = 2;
        __l._M_array = &peiceBuffer;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_88,__l,&local_149);
        processFunction(this,&local_88,false);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_88);
        lVar6 = 0x20;
        do {
          std::__cxx11::string::~string(local_a8 + lVar6 + -0x20);
          lVar6 = lVar6 + -0x20;
        } while (lVar6 != -0x20);
        argCount = argCount + 1;
        iVar7 = iVar7 + 1;
        std::__cxx11::string::~string((string *)&arg);
      }
      uVar9 = (ulong)(iVar7 + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&components);
    std::__cxx11::string::~string((string *)&line);
    local_100.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = local_e0;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_100);
  return 0;
}

Assistant:

unsigned int Compiler::evaluateBracket(std::string originalLine)
{
    unsigned int variablesOnStack = 0;
    variablesOnStack = 0;
    auto addVariableToStack = [&] (const std::string &data) -> void
    {
        if(igen.isVariable(data) != -1) //If it's a variable
        {
            igen.genCloneTop(data);
        }
        else //Else if it's raw data
        {
            if(data[0] == '"') //If string
            {
                igen.genCreateString("", data.substr(1, data.size()-2));
            }
            else if(data[0] == '\'') //If character
            {
                igen.genCreateChar("", data[1]);
            }
            else if(data == "true") //If boolean
            {
                igen.genCreateBool("", true);
            }
            else if(data == "false") //If boolean
            {
                igen.genCreateBool("", false);
            }
            else //Else if number
            {
                igen.genCreateInt("", stoull(data));
            }
        }
    };

    auto handleSubSegment = [&] (const std::vector<std::string> &segments) -> void
    {
        //Get operator of bracket if any
        const std::string &segmentOperator = segments.back();
        //Check to see if it's a variable, if so, float to top of stack
        Instruction segmentInstruction = stringToInstruction(segmentOperator);
        for(unsigned int a = 0; a < segments.size()-1; a++)
        {
            addVariableToStack(segments[a]);
        }
        //If it's an instruction
        if(segmentInstruction != Instruction::NONE)
        {
            if(segments.size() == 1)
            {
                igen.genOperator(segmentInstruction, variablesOnStack);
                variablesOnStack = 0;
            }
            else
            {
                igen.genOperator(segmentInstruction, segments.size() - 1);
            }
            variablesOnStack++;
        }
        else //Else if its a piece of data
        {
            if(segments.size() == 1)
            {
                addVariableToStack(segmentOperator);
                variablesOnStack++;
            }
            variablesOnStack += segments.size()-1;
        }
    };

    //Split the arguments
    std::vector<std::string> &&arguments = parser.extractBracketArguments(originalLine);

    //Bracket all arguments, removing unneeded spaces
    for(auto &arg : arguments)
    {
        while(arg[0] == ' ')
            arg.erase(0, 1);
        arg.insert(0, "(");
        while(arg[arg.size()-1] == ' ')
            arg.erase(arg.size()-1, 1);
        arg += ")";
    }

    //Parse each argument separately
    for(auto iter = arguments.rbegin(); iter != arguments.rend(); iter++)
    {
        variablesOnStack = 0;
        const std::string &lineToParse = *iter;
        std::string line = parser.bracketOperatorFix(lineToParse);
        std::vector<std::string> components;
        parser.extractBracket(line, components);

        //Split segments by space
        for(unsigned int a = 0; a < components.size(); a++)
        {
            const std::string &segment = components[a];

            //If it's a function, call it
            Scope *possibleFunction = getPastScope(segment);
            if(possibleFunction != nullptr) //It's a function
            {
                //Take arguments from next segment only if the function accepts arguments
                std::string arg;
                if(possibleFunction->argumentCount > 0)
                    arg = components[++a];

                //Call it with the provided arguments if any, not destroying the return value
                processFunction({segment, arg}, false);
                variablesOnStack++;
                a++;
            }
            else //It's not a function
            {
                //Split by space
                std::string peiceBuffer;
                std::vector<std::string> subSegment;
                bool isQuoteOpen = false;
                for(unsigned int c = 0; c < segment.size(); c++)
                {
                    if(segment[c] == '"')
                        isQuoteOpen = !isQuoteOpen;
                    if(segment[c] == ' ' && isQuoteOpen == false)
                    {
                        subSegment.emplace_back(peiceBuffer);
                        peiceBuffer.clear();
                    }
                    else
                    {
                        peiceBuffer += segment[c];
                    }
                }
                subSegment.emplace_back(peiceBuffer);
                handleSubSegment(subSegment);
            }
        }
    }
    return 0;
}